

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

void sendOneToEachReaderRank(SstStream Stream,CMFormat f,void *Msg,void **RS_StreamPtr)

{
  SstStream in_RDI;
  void *unaff_retaddr;
  WS_ReaderInfo CP_WSR_Stream;
  WS_ReaderInfo in_stack_00000010;
  int i;
  uint local_24;
  
  for (local_24 = 0; (int)local_24 < in_RDI->ReaderCount; local_24 = local_24 + 1) {
    if (in_RDI->Readers[(int)local_24]->ReaderStatus == Established) {
      CP_verbose(in_RDI,TraceVerbose,"Working on reader cohort %d\n",(ulong)local_24);
      sendOneToWSRCohort(in_stack_00000010,(CMFormat)CP_WSR_Stream,unaff_retaddr,&in_RDI->CPInfo);
    }
    else {
      CP_verbose(in_RDI,TraceVerbose,"Skipping reader cohort %d\n",(ulong)local_24);
    }
  }
  return;
}

Assistant:

void sendOneToEachReaderRank(SstStream Stream, CMFormat f, void *Msg, void **RS_StreamPtr)
{
    STREAM_ASSERT_LOCKED(Stream);
    for (int i = 0; i < Stream->ReaderCount; i++)
    {
        WS_ReaderInfo CP_WSR_Stream = Stream->Readers[i];
        if (CP_WSR_Stream->ReaderStatus == Established)
        {
            CP_verbose(Stream, TraceVerbose, "Working on reader cohort %d\n", i);
        }
        else
        {
            CP_verbose(Stream, TraceVerbose, "Skipping reader cohort %d\n", i);
            continue;
        }
        sendOneToWSRCohort(CP_WSR_Stream, f, Msg, RS_StreamPtr);
    }
}